

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UdpSimpleFieldSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::UdpSimpleFieldSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  UdpSimpleFieldSyntax *pUVar6;
  
  pUVar6 = (UdpSimpleFieldSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UdpSimpleFieldSyntax *)this->endPtr < pUVar6 + 1) {
    pUVar6 = (UdpSimpleFieldSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pUVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pUVar6->super_UdpFieldBaseSyntax).super_SyntaxNode.kind = UdpSimpleField;
  (pUVar6->super_UdpFieldBaseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pUVar6->super_UdpFieldBaseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pUVar6->field).kind = TVar2;
  (pUVar6->field).field_0x2 = uVar3;
  (pUVar6->field).numFlags = (NumericTokenFlags)NVar4.raw;
  (pUVar6->field).rawLen = uVar5;
  (pUVar6->field).info = pIVar1;
  return pUVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }